

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.cpp
# Opt level: O1

string * StringTools::urlEncode
                   (string *__return_storage_ptr__,string *value,string *additionalLegitChars)

{
  size_type sVar1;
  pointer pcVar2;
  string *psVar3;
  ostream oVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  ostream *poVar8;
  size_type sVar9;
  stringstream ss;
  char local_1c9;
  string *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  local_1c0 = additionalLegitChars;
  if ((urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
       legitPunctuation_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::legitPunctuation_abi_cxx11_), iVar5 != 0)) {
    urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::legitPunctuation_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                   legitPunctuation_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                legitPunctuation_abi_cxx11_,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789_.-~:","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                  legitPunctuation_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&urlEncode(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                         legitPunctuation_abi_cxx11_);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  sVar1 = value->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (value->_M_dataplus)._M_p;
    sVar9 = 0;
    do {
      lVar6 = std::__cxx11::string::find('H',(ulong)(uint)(int)pcVar2[sVar9]);
      if ((lVar6 == -1) &&
         (lVar6 = std::__cxx11::string::find((char)local_1c0,(ulong)(uint)(int)pcVar2[sVar9]),
         lVar6 == -1)) {
        local_1c9 = '%';
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1c9,1);
        lVar6 = *(long *)poVar7;
        *(uint *)(poVar7 + *(long *)(lVar6 + -0x18) + 0x18) =
             *(uint *)(poVar7 + *(long *)(lVar6 + -0x18) + 0x18) | 0x4000;
        lVar6 = *(long *)(lVar6 + -0x18);
        poVar8 = poVar7 + lVar6;
        if (poVar7[lVar6 + 0xe1] == (ostream)0x0) {
          oVar4 = (ostream)std::ios::widen((char)poVar8);
          poVar8[0xe0] = oVar4;
          poVar8[0xe1] = (ostream)0x1;
        }
        poVar8[0xe0] = (ostream)0x30;
        lVar6 = *(long *)poVar7;
        *(undefined8 *)(poVar7 + *(long *)(lVar6 + -0x18) + 0x10) = 2;
        lVar6 = *(long *)(lVar6 + -0x18);
        *(uint *)(poVar7 + lVar6 + 0x18) = *(uint *)(poVar7 + lVar6 + 0x18) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      }
      else {
        local_1c9 = pcVar2[sVar9];
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1c9,1);
      }
      sVar9 = sVar9 + 1;
    } while (sVar1 != sVar9);
  }
  psVar3 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

string urlEncode(const string& value, const std::string& additionalLegitChars) {
    static const string legitPunctuation = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789_.-~:";
    std::stringstream ss;
    for (auto const &c : value) {
        if ((legitPunctuation.find(c) == std::string::npos) && (additionalLegitChars.find(c) == std::string::npos)) {
            ss << '%' << std::uppercase << std::setfill('0') << std::setw(2) << std::hex << (unsigned int)(unsigned char)c;
        } else {
            ss << c;
        }
    }

    return ss.str();
}